

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::UninterpretedOption::Clear(UninterpretedOption *this)

{
  bool bVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogFinisher local_11a;
  byte local_119;
  LogMessage local_118;
  LogFinisher local_da;
  byte local_d9;
  LogMessage local_d8;
  LogFinisher local_9d [20];
  byte local_89;
  LogMessage local_88;
  UninterpretedOption *local_50;
  UninterpretedOption *this_local;
  InternalMetadataWithArena *local_40;
  InternalMetadataWithArena *local_38;
  undefined4 local_2c;
  HasBits<1UL> *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_50 = this;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::Clear(&this->name_);
  local_18 = &this->_has_bits_;
  local_1c = 0;
  if ((local_18->has_bits_[0] & 7) != 0) {
    bVar1 = has_identifier_value(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->identifier_value_,psVar2);
      local_89 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x34f1);
        local_89 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_88,
                            "CHECK failed: !identifier_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(local_9d,pLVar3);
      }
      if ((local_89 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_88);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->identifier_value_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_string_value(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->string_value_,psVar2);
      local_d9 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x34f5);
        local_d9 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_d8,
                            "CHECK failed: !string_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_da,pLVar3);
      }
      if ((local_d9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_d8);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->string_value_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_aggregate_value(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->aggregate_value_,psVar2);
      local_119 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_118,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x34f9);
        local_119 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_118,
                            "CHECK failed: !aggregate_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_11a,pLVar3);
      }
      if ((local_119 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_118);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->aggregate_value_);
      std::__cxx11::string::clear();
    }
  }
  local_28 = &this->_has_bits_;
  local_2c = 0;
  if ((local_28->has_bits_[0] & 0x38) != 0) {
    memset(&this->positive_int_value_,0,0x18);
  }
  this_local = (UninterpretedOption *)&this->_has_bits_;
  memset(this_local,0,4);
  local_40 = &this->_internal_metadata_;
  if (((uint)(local_40->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_38 = local_40;
    local_10 = local_40;
    internal::InternalMetadataWithArena::DoClear(local_40);
  }
  return;
}

Assistant:

void UninterpretedOption::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.UninterpretedOption)
  name_.Clear();
  if (_has_bits_[0 / 32] & 7u) {
    if (has_identifier_value()) {
      GOOGLE_DCHECK(!identifier_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*identifier_value_.UnsafeRawStringPointer())->clear();
    }
    if (has_string_value()) {
      GOOGLE_DCHECK(!string_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*string_value_.UnsafeRawStringPointer())->clear();
    }
    if (has_aggregate_value()) {
      GOOGLE_DCHECK(!aggregate_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*aggregate_value_.UnsafeRawStringPointer())->clear();
    }
  }
  if (_has_bits_[0 / 32] & 56u) {
    ::memset(&positive_int_value_, 0, reinterpret_cast<char*>(&double_value_) -
      reinterpret_cast<char*>(&positive_int_value_) + sizeof(double_value_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}